

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

BinsSelectExpressionSyntax * __thiscall
slang::parsing::Parser::parseBinsSelectExpression(Parser *this)

{
  bool bVar1;
  BinaryBinsSelectExprSyntax *left;
  BinsSelectExpressionSyntax *right;
  Token op;
  
  left = (BinaryBinsSelectExprSyntax *)parseBinsSelectPrimary(this);
  do {
    bVar1 = ParserBase::peek(&this->super_ParserBase,DoubleAnd);
    if (!bVar1) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,DoubleOr);
      if (!bVar1) {
        return &left->super_BinsSelectExpressionSyntax;
      }
    }
    op = ParserBase::consume(&this->super_ParserBase);
    right = parseBinsSelectPrimary(this);
    left = slang::syntax::SyntaxFactory::binaryBinsSelectExpr
                     (&this->factory,&left->super_BinsSelectExpressionSyntax,op,right);
  } while( true );
}

Assistant:

BinsSelectExpressionSyntax& Parser::parseBinsSelectExpression() {
    auto curr = &parseBinsSelectPrimary();
    while (peek(TokenKind::DoubleAnd) || peek(TokenKind::DoubleOr)) {
        auto op = consume();
        curr = &factory.binaryBinsSelectExpr(*curr, op, parseBinsSelectPrimary());
    }
    return *curr;
}